

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O1

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name)

{
  char cVar1;
  StkId pSVar2;
  lu_byte lVar3;
  byte bVar4;
  LClosure *o;
  Proto *v;
  char *why;
  LClosure *x_;
  lua_Integer x;
  LoadState local_38;
  double local_20;
  
  cVar1 = *name;
  if (cVar1 == '\x1b') {
    name = "binary string";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    name = name + 1;
  }
  local_38.L = L;
  local_38.Z = Z;
  local_38.name = name;
  checkliteral(&local_38,"Lua","not a binary chunk");
  lVar3 = loadByte(&local_38);
  if (lVar3 == 'T') {
    lVar3 = loadByte(&local_38);
    if (lVar3 == '\0') {
      checkliteral(&local_38,anon_var_dwarf_16c4b,"corrupted chunk");
      fchecksize(&local_38,4,"Instruction");
      fchecksize(&local_38,8,"lua_Integer");
      fchecksize(&local_38,8,"lua_Number");
      loadBlock(&local_38,&local_20,8);
      if (local_20 == 1.09366371363418e-319) {
        loadBlock(&local_38,&local_20,8);
        if ((local_20 == 370.5) && (!NAN(local_20))) {
          bVar4 = loadByte(&local_38);
          o = luaF_newLclosure(L,(uint)bVar4);
          pSVar2 = (L->top).p;
          *(LClosure **)pSVar2 = o;
          (pSVar2->val).tt_ = 'F';
          luaD_inctop(L);
          v = luaF_newproto(L);
          o->p = v;
          if (((o->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
            luaC_barrier_(L,(GCObject *)o,(GCObject *)v);
          }
          loadFunction(&local_38,o->p,(TString *)0x0);
          return o;
        }
        why = "float format mismatch";
      }
      else {
        why = "integer format mismatch";
      }
    }
    else {
      why = "format mismatch";
    }
  }
  else {
    why = "version mismatch";
  }
  error(&local_38,why);
}

Assistant:

LClosure *luaU_undump(lua_State *L, ZIO *Z, const char *name) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  checkHeader(&S);
  cl = luaF_newLclosure(L, loadByte(&S));
  setclLvalue2s(L, L->top.p, cl);
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  loadFunction(&S, cl->p, NULL);
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luai_verifycode(L, cl->p);
  return cl;
}